

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

FedObject * __thiscall MasterObjectHolder::findFed(MasterObjectHolder *this,string_view fedName)

{
  _Elt_pointer puVar1;
  long lVar2;
  bool bVar3;
  FedObject *pFVar4;
  _Elt_pointer puVar5;
  _Map_pointer ppuVar6;
  _Elt_pointer puVar7;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  handle handle;
  handle local_48;
  
  gmlc::libguarded::
  guarded<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
  ::lock(&local_48,&this->feds);
  puVar5 = ((local_48.data)->
           super__Deque_base<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  puVar7 = ((local_48.data)->
           super__Deque_base<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_last;
  ppuVar6 = ((local_48.data)->
            super__Deque_base<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
            )._M_impl.super__Deque_impl_data._M_start._M_node;
  puVar1 = ((local_48.data)->
           super__Deque_base<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
           )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  do {
    if (puVar5 == puVar1) {
      pFVar4 = (FedObject *)0x0;
LAB_0017827b:
      std::unique_lock<std::mutex>::~unique_lock(&local_48.m_handle_lock);
      return pFVar4;
    }
    pFVar4 = (puVar5->_M_t).
             super___uniq_ptr_impl<helics::FedObject,_std::default_delete<helics::FedObject>_>._M_t.
             super__Tuple_impl<0UL,_helics::FedObject_*,_std::default_delete<helics::FedObject>_>.
             super__Head_base<0UL,_helics::FedObject_*,_false>._M_head_impl;
    if ((pFVar4 != (FedObject *)0x0) &&
       (lVar2 = (long)(pFVar4->fedptr).
                      super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
       lVar2 != 0)) {
      __y._M_str = *(char **)(lVar2 + 0x78);
      __y._M_len = *(size_t *)(lVar2 + 0x80);
      bVar3 = std::operator==(fedName,__y);
      if (bVar3) {
        pFVar4 = (puVar5->_M_t).
                 super___uniq_ptr_impl<helics::FedObject,_std::default_delete<helics::FedObject>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_helics::FedObject_*,_std::default_delete<helics::FedObject>_>
                 .super__Head_base<0UL,_helics::FedObject_*,_false>._M_head_impl;
        goto LAB_0017827b;
      }
    }
    puVar5 = puVar5 + 1;
    if (puVar5 == puVar7) {
      puVar5 = ppuVar6[1];
      ppuVar6 = ppuVar6 + 1;
      puVar7 = puVar5 + 0x40;
    }
  } while( true );
}

Assistant:

helics::FedObject* MasterObjectHolder::findFed(std::string_view fedName)
{
    auto handle = feds.lock();
    for (auto& fed : (*handle)) {
        if ((fed) && (fed->fedptr)) {
            if (fed->fedptr->getName() == fedName) {
                return fed.get();
            }
        }
    }
    return nullptr;
}